

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::SourceLocationTable::FindImport
          (SourceLocationTable *this,Message *descriptor,string *name,int *line,int *column)

{
  second_type *psVar1;
  int iVar2;
  undefined1 local_48 [40];
  
  local_48._0_8_ = descriptor;
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)name);
  psVar1 = FindOrNull<std::map<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>,std::less<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>>
                     (&this->import_location_map_,(first_type *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (psVar1 == (second_type *)0x0) {
    *line = -1;
    iVar2 = 0;
  }
  else {
    *line = psVar1->first;
    iVar2 = psVar1->second;
  }
  *column = iVar2;
  return psVar1 != (second_type *)0x0;
}

Assistant:

bool SourceLocationTable::FindImport(const Message* descriptor,
                                     const std::string& name, int* line,
                                     int* column) const {
  const std::pair<int, int>* result =
      FindOrNull(import_location_map_, std::make_pair(descriptor, name));
  if (result == nullptr) {
    *line = -1;
    *column = 0;
    return false;
  } else {
    *line = result->first;
    *column = result->second;
    return true;
  }
}